

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<ImDrawCmd>::push_front(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  ImDrawCmd *in_RSI;
  ImDrawCmd *in_RDI;
  ImVector<ImDrawCmd> *unaff_retaddr;
  
  if ((in_RDI->ClipRect).x == 0.0) {
    push_back((ImVector<ImDrawCmd> *)in_RSI,in_RDI);
  }
  else {
    insert(unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }